

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O0

PermutationMatrix<_1,__1,_int> * __thiscall
Eigen::PermutationBase<Eigen::PermutationMatrix<-1,-1,int>>::operator=
          (PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *this,
          TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *tr)

{
  PermutationMatrix<_1,__1,_int> *pPVar1;
  PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *in_RDI;
  PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *unaff_retaddr;
  Index k;
  Index in_stack_ffffffffffffffdc;
  undefined4 local_14;
  PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *pPVar2;
  
  pPVar2 = in_RDI;
  TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::size
            ((TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)0x2db5f2);
  PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::setIdentity
            (in_RDI,in_stack_ffffffffffffffdc);
  local_14 = PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::size
                       ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)0x2db608);
  while (local_14 = local_14 + -1, -1 < local_14) {
    TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::coeff
              ((TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)in_RDI,local_14);
    PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::applyTranspositionOnTheRight
              (unaff_retaddr,(Index)((ulong)pPVar2 >> 0x20),(Index)pPVar2);
  }
  pPVar1 = EigenBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::derived
                     ((EigenBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)in_RDI);
  return pPVar1;
}

Assistant:

Derived& operator=(const TranspositionsBase<OtherDerived>& tr)
    {
      setIdentity(tr.size());
      for(Index k=size()-1; k>=0; --k)
        applyTranspositionOnTheRight(k,tr.coeff(k));
      return derived();
    }